

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  unsigned_long_long uVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  undefined1 local_78 [16];
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar9);
    dVar6 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
    local_78._8_4_ = SUB84(dVar6,0);
    local_78._0_8_ = dVar6 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    local_78._12_4_ = (int)((ulong)dVar6 >> 0x20);
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar9);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar5 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                  pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    dVar6 = pIVar4->YAxis[iVar10].Range.Min;
    local_3c.y = (float)((((double)(float)(dVar5 / pIVar7->LogDenY[iVar10]) *
                           (pIVar4->YAxis[iVar10].Range.Max - dVar6) + dVar6) - dVar6) *
                         pIVar7->My[iVar10] + (double)pIVar7->PixelRange[iVar10].Min.y);
    local_3c.x = (float)(((double)local_78._0_8_ - (pIVar4->XAxis).Range.Min) * pIVar7->Mx +
                        (double)pIVar7->PixelRange[iVar10].Min.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLinLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLinLog>
                *)local_58,local_60,&pIVar4->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar9);
    dVar6 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
    local_78._8_4_ = SUB84(dVar6,0);
    local_78._0_8_ = dVar6 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    local_78._12_4_ = (int)((ulong)dVar6 >> 0x20);
    uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar9);
    dVar5 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                  pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    dVar6 = pIVar4->YAxis[iVar10].Range.Min;
    local_58._4_4_ =
         (float)((((double)(float)(dVar5 / pIVar7->LogDenY[iVar10]) *
                   (pIVar4->YAxis[iVar10].Range.Max - dVar6) + dVar6) - dVar6) * pIVar7->My[iVar10]
                + (double)pIVar7->PixelRange[iVar10].Min.y);
    local_58._0_4_ =
         (float)(((double)local_78._0_8_ - (pIVar4->XAxis).Range.Min) * pIVar7->Mx +
                (double)pIVar7->PixelRange[iVar10].Min.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar9);
        dVar6 = (double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25;
        local_78._8_4_ = SUB84(dVar6,0);
        local_78._0_8_ = dVar6 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        local_78._12_4_ = (int)((ulong)dVar6 >> 0x20);
        uVar3 = *(unsigned_long_long *)((long)getter->Ys + lVar9);
        dVar5 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                      + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        iVar10 = transformer->YAxis;
        pIVar4 = pIVar8->CurrentPlot;
        dVar6 = pIVar4->YAxis[iVar10].Range.Min;
        fVar13 = (float)(((double)local_78._0_8_ - (pIVar4->XAxis).Range.Min) * pIVar8->Mx +
                        (double)pIVar8->PixelRange[iVar10].Min.x);
        fVar12 = (float)((((double)(float)(dVar5 / pIVar8->LogDenY[iVar10]) *
                           (pIVar4->YAxis[iVar10].Range.Max - dVar6) + dVar6) - dVar6) *
                         pIVar8->My[iVar10] + (double)pIVar8->PixelRange[iVar10].Min.y);
        local_80.y = fVar12;
        local_80.x = fVar13;
        pIVar4 = pIVar7->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar2 = fVar12;
        }
        if ((fVar2 < (pIVar4->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           local_58._4_4_ & -(uint)(fVar12 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar13 <= (float)local_58._0_4_) {
            fVar2 = fVar13;
          }
          if ((fVar2 < (pIVar4->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar13 <= (float)local_58._0_4_) & (uint)fVar13 |
                             local_58._0_4_ & -(uint)(fVar13 <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_80,col,line_weight);
          }
        }
        local_58._0_4_ = local_80.x;
        local_58._4_4_ = local_80.y;
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}